

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O0

bool __thiscall ON_CurveArray::Write(ON_CurveArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  int local_20;
  bool local_19;
  int i;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_CurveArray *this_local;
  
  local_19 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
  if (local_19) {
    local_19 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
  }
  if (local_19 != false) {
    iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&this->super_ON_SimpleArray<ON_Curve_*>);
    local_19 = ON_BinaryArchive::WriteInt(file,iVar2);
    local_20 = 0;
    while( true ) {
      bVar1 = false;
      if (local_19 != false) {
        iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&this->super_ON_SimpleArray<ON_Curve_*>);
        bVar1 = local_20 < iVar2;
      }
      if (!bVar1) break;
      if ((this->super_ON_SimpleArray<ON_Curve_*>).m_a[local_20] == (ON_Curve *)0x0) {
        local_19 = ON_BinaryArchive::WriteInt(file,0);
      }
      else {
        local_19 = ON_BinaryArchive::WriteInt(file,1);
        if (local_19) {
          local_19 = ON_BinaryArchive::WriteObject
                               (file,(ON_Object *)
                                     (this->super_ON_SimpleArray<ON_Curve_*>).m_a[local_20]);
        }
      }
      local_20 = local_20 + 1;
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool ON_CurveArray::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
  if (rc) rc = file.Write3dmChunkVersion(1,0);
  if (rc ) {
    int i;
    rc = file.WriteInt( Count() );
    for ( i = 0; rc && i < Count(); i++ ) {
      if ( m_a[i] ) {
        rc = file.WriteInt(1);
        if ( rc ) 
          rc = file.WriteObject( *m_a[i] ); // polymorphic curves
      }
      else {
        // nullptr curve
        rc = file.WriteInt(0);
      }
    }
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}